

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::Read(ON_PolyCurve *this,ON_BinaryArchive *file)

{
  int iVar1;
  uint uVar2;
  byte local_81;
  undefined1 local_78 [8];
  ON_BoundingBox bbox;
  int reserved2;
  int reserved1;
  int segment_count;
  int segment_index;
  ON_Curve *crv;
  ON_Object *obj;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_PolyCurve *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  Destroy(this);
  iStack_1c = 0;
  local_20 = 0;
  obj._7_1_ = ON_BinaryArchive::Read3dmChunkVersion
                        (_minor_version,&stack0xffffffffffffffe4,&local_20);
  if ((bool)obj._7_1_) {
    reserved2 = 0;
    bbox.m_max.z._4_4_ = 0;
    bbox.m_max.z._0_4_ = 0;
    obj._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,&reserved2);
    if ((bool)obj._7_1_) {
      obj._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)((long)&bbox.m_max.z + 4));
    }
    if ((bool)obj._7_1_ != false) {
      obj._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&bbox.m_max.z);
    }
    if ((bool)obj._7_1_ != false) {
      ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_78);
      obj._7_1_ = ON_BinaryArchive::ReadBoundingBox(_minor_version,(ON_BoundingBox *)local_78);
    }
    if ((bool)obj._7_1_ != false) {
      obj._7_1_ = ON_BinaryArchive::ReadArray(_minor_version,&this->m_t);
    }
    reserved1 = 0;
    while( true ) {
      local_81 = 0;
      if (reserved1 < reserved2) {
        local_81 = obj._7_1_;
      }
      if ((local_81 & 1) == 0) break;
      crv = (ON_Curve *)0x0;
      _segment_count = (ON_Curve *)0x0;
      iVar1 = ON_BinaryArchive::ReadObject(_minor_version,(ON_Object **)&crv);
      obj._7_1_ = iVar1 != 0;
      if ((bool)obj._7_1_) {
        _segment_count = ON_Curve::Cast((ON_Object *)crv);
        if (_segment_count == (ON_Curve *)0x0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_polycurve.cpp"
                     ,0x1e1,"","ON_PolyCurve::Read() - non ON_Curve object in segment list\n");
          if (crv != (ON_Curve *)0x0) {
            (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
          }
          obj._7_1_ = 0;
        }
        else {
          ON_SimpleArray<ON_Curve_*>::Append
                    (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&segment_count
                    );
        }
      }
      reserved1 = reserved1 + 1;
    }
    if (((((obj._7_1_ & 1) != 0) &&
         (iVar1 = ON_SimpleArray<ON_Curve_*>::Count
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>), 0 < iVar1)) &&
        (iVar1 = ON_SimpleArray<ON_Curve_*>::Count
                           (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>), iVar1 == reserved2
        )) && (iVar1 = ON_SimpleArray<double>::Count(&this->m_t), iVar1 == reserved2 + 1)) {
      SanitizeDomain(this);
    }
  }
  if (((obj._7_1_ & 1) != 0) &&
     (uVar2 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_minor_version), uVar2 < 0xbf065d0)) {
    RemoveNesting(this);
  }
  return (bool)(obj._7_1_ & 1);
}

Assistant:

bool ON_PolyCurve::Read(
       ON_BinaryArchive& file  // open binary file
     )
{
  // NOTE - if changed, check legacy I/O code
  Destroy();
  int major_version = 0;
  int minor_version = 0;
  
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  
  if (rc) 
  {
    ON_Object* obj;
    ON_Curve* crv;
    int segment_index;
    int segment_count = 0;
    int reserved1 = 0;
    int reserved2 = 0;
    rc = file.ReadInt(&segment_count);
    if (rc) rc = file.ReadInt(&reserved1);
    if (rc) rc = file.ReadInt(&reserved2);
    if (rc) {
      // may be set in future
      ON_BoundingBox bbox;
      rc = file.ReadBoundingBox(bbox);
    }
    if (rc) rc = file.ReadArray( m_t );

    for ( segment_index = 0; segment_index < segment_count && rc; segment_index++ ) {
      obj = 0;
      crv = 0;
      rc = file.ReadObject( &obj );
      if (rc) {
        crv = ON_Curve::Cast(obj);
        if (crv) {
          //Append(crv); - this one adds to m_t[]
          m_segment.Append(crv);
        }
        else {
          ON_ERROR("ON_PolyCurve::Read() - non ON_Curve object in segment list\n");
          delete obj;
          rc = false;
        }
      }
    }

    if ( rc && m_segment.Count()>0 && 
								m_segment.Count()==segment_count && m_t.Count()==segment_count+1)
    {
      // remove "fuzz" in m_t[] domain array that is in some older files.
      SanitizeDomain();
      /*
      double s, t, d0, d1, fuzz;
      ON_Interval in0, in1;
      in1 = SegmentCurve(0)->Domain();
      d1 = in1.Length();
      for ( segment_index = 1; segment_index < segment_count; segment_index++ )
      {
        t = m_t[segment_index];
        in0 = in1;
        d0 = d1;
        in1 = SegmentCurve(segment_index)->Domain();
        d1 = in1.Length();
        s = in0[1];
        if ( s != t && s == in1[0] && t > in0[0] && t < in1[1] )
        {
          fuzz = ((d0<=d1)?d0:d1)*ON_SQRT_EPSILON;
          if ( fabs(t-s) <= fuzz )
            m_t[segment_index] = s;
        }
      }
      fuzz = d1*ON_SQRT_EPSILON;
      t = m_t[segment_count];
      s = in1[1];
      if ( s != t && t > in1[0] && fabs(s-t) <= fuzz )
        m_t[segment_count] = s;
        */
    }
  }

  if (rc && file.ArchiveOpenNURBSVersion() < 200304080 )
  {
    // 8 April 2003 Dale Lear:
    //   Some archives written by earlier versions
    //   of Rhino had nested polycurves and polycurves with
    //   zero length segments.  This code cleans up
    //   those problems.  See RR 8932.
    RemoveNesting();
    //RemoveShortSegments(ON_ZERO_TOLERANCE);
  }

  return rc;
}